

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

void lj_ir_kvalue(lua_State *L,TValue *tv,IRIns *ir)

{
  byte bVar1;
  void *pvVar2;
  TValue TVar3;
  
  switch((ir->field_1).o) {
  case '\x15':
    (tv->field_2).it = (int)(char)(~(ir->field_1).t.irt | 0xe0);
    break;
  case '\x16':
    TVar3.n = (lua_Number)ir->i;
    goto LAB_0012e5d2;
  case '\x17':
    bVar1 = (ir->field_1).t.irt;
    (tv->field_2).field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(ir->field_1).op12;
    (tv->field_2).it = (int)(char)(~bVar1 | 0xe0);
    break;
  case '\x18':
  case '\x19':
  case '\x1a':
    tv->u64 = (ulong)(ir->field_1).op12 | 0xffff000000000000;
    break;
  case '\x1b':
    TVar3 = *(TValue *)(ulong)(ir->field_1).op12;
LAB_0012e5d2:
    *tv = TVar3;
    break;
  case '\x1c':
    pvVar2 = lj_mem_newgco(L,0x10);
    *(undefined1 *)((long)pvVar2 + 5) = 10;
    *(undefined2 *)((long)pvVar2 + 6) = 0xb;
    *(undefined8 *)((long)pvVar2 + 8) = *(undefined8 *)(ulong)(ir->field_1).op12;
    (tv->u32).lo = (uint32_t)pvVar2;
    (tv->field_2).it = 0xfffffff5;
  }
  return;
}

Assistant:

void lj_ir_kvalue(lua_State *L, TValue *tv, const IRIns *ir)
{
  UNUSED(L);
  lua_assert(ir->o != IR_KSLOT);  /* Common mistake. */
  switch (ir->o) {
  case IR_KPRI: setitype(tv, irt_toitype(ir->t)); break;
  case IR_KINT: setintV(tv, ir->i); break;
  case IR_KGC: setgcV(L, tv, ir_kgc(ir), irt_toitype(ir->t)); break;
  case IR_KPTR: case IR_KKPTR: case IR_KNULL:
    setlightudV(tv, mref(ir->ptr, void));
    break;
  case IR_KNUM: setnumV(tv, ir_knum(ir)->n); break;
#if LJ_HASFFI
  case IR_KINT64: {
    GCcdata *cd = lj_cdata_new_(L, CTID_INT64, 8);
    *(uint64_t *)cdataptr(cd) = ir_kint64(ir)->u64;
    setcdataV(L, tv, cd);
    break;
    }
#endif
  default: lua_assert(0); break;
  }
}